

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_16x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  undefined1 auVar15 [16];
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  __m128i y_select_1;
  int y_mask_1;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  __m128i left;
  __m128i round;
  __m128i scaled_top_right2;
  __m128i scaled_top_right1;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights2;
  __m128i weights1;
  __m128i scale;
  __m128i weights;
  __m128i top_right;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_e7c;
  int local_e4c;
  int local_e1c;
  int local_dec;
  undefined8 *local_d18;
  byte local_c58;
  undefined1 uStack_c57;
  undefined1 uStack_c56;
  undefined1 uStack_c55;
  byte bStack_c54;
  undefined1 uStack_c53;
  undefined1 uStack_c52;
  undefined1 uStack_c51;
  byte local_c18;
  undefined1 uStack_c17;
  undefined1 uStack_c16;
  undefined1 uStack_c15;
  byte bStack_c14;
  undefined1 uStack_c13;
  undefined1 uStack_c12;
  undefined1 uStack_c11;
  byte local_bd8;
  undefined1 uStack_bd7;
  undefined1 uStack_bd6;
  undefined1 uStack_bd5;
  byte bStack_bd4;
  undefined1 uStack_bd3;
  undefined1 uStack_bd2;
  undefined1 uStack_bd1;
  byte local_b98;
  undefined1 uStack_b97;
  undefined1 uStack_b96;
  undefined1 uStack_b95;
  byte bStack_b94;
  undefined1 uStack_b93;
  undefined1 uStack_b92;
  undefined1 uStack_b91;
  ushort uStack_ac2;
  ushort uStack_aba;
  ushort uStack_aa6;
  ushort uStack_aa4;
  ushort uStack_aa2;
  ushort uStack_a9e;
  ushort uStack_a9c;
  ushort uStack_a9a;
  short local_838;
  short sStack_836;
  short sStack_834;
  short sStack_832;
  short sStack_830;
  short sStack_82e;
  short sStack_82c;
  short sStack_82a;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short sStack_670;
  short sStack_66e;
  short sStack_66c;
  short sStack_66a;
  short local_4b8;
  short sStack_4b6;
  short sStack_4b4;
  short sStack_4b2;
  short sStack_4b0;
  short sStack_4ae;
  short sStack_4ac;
  short sStack_4aa;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  __m128i left_y_3;
  __m128i y_select_3;
  int y_mask_3;
  __m128i left_y_2;
  __m128i y_select_2;
  int y_mask_2;
  __m128i left_y_1;
  
  bVar2 = *(byte *)(in_RDX + 0xf);
  uVar10 = (ushort)bVar2;
  uStack_aa6 = (ushort)bVar2;
  uStack_aa4 = (ushort)bVar2;
  uStack_aa2 = (ushort)bVar2;
  uStack_a9e = (ushort)bVar2;
  uStack_a9c = (ushort)bVar2;
  uStack_a9a = (ushort)bVar2;
  sVar45 = uStack_aa6 * 0x1f;
  sVar47 = uStack_aa4 * 0x3c;
  sVar49 = uStack_aa2 * 0x56;
  sVar51 = uVar10 * 0x6f;
  sVar53 = uStack_a9e * 0x85;
  sVar55 = uStack_a9c * 0x9a;
  sVar57 = uStack_a9a * 0xac;
  uStack_ac2 = (ushort)bVar2;
  uStack_aba = (ushort)bVar2;
  sVar44 = uVar10 * 0xbc;
  sVar46 = uStack_aa6 * 0xca;
  sVar48 = uStack_aa4 * 0xd5;
  sVar50 = uStack_ac2 * 0xdf;
  sVar52 = uVar10 * 0xe6;
  sVar54 = uStack_a9e * 0xec;
  sVar56 = uStack_a9c * 0xef;
  sVar58 = uStack_aba * 0xf0;
  uVar1 = *in_RCX;
  local_b98 = (byte)uVar1;
  uStack_b97 = (undefined1)((ulong)uVar1 >> 8);
  uStack_b96 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_b95 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_b94 = (byte)((ulong)uVar1 >> 0x20);
  uStack_b93 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_b92 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_b91 = (undefined1)((ulong)uVar1 >> 0x38);
  local_d18 = in_RDI;
  for (local_dec = 0x1000100; local_dec < 0xf0e0f0f; local_dec = local_dec + 0x2020202) {
    auVar8._4_4_ = local_dec;
    auVar8._0_4_ = local_dec;
    auVar8._12_4_ = local_dec;
    auVar8._8_4_ = local_dec;
    auVar9[1] = 0;
    auVar9[0] = local_b98;
    auVar9[2] = uStack_b97;
    auVar9[3] = 0;
    auVar9[4] = uStack_b96;
    auVar9[5] = 0;
    auVar9[6] = uStack_b95;
    auVar9[7] = 0;
    auVar9[9] = 0;
    auVar9[8] = bStack_b94;
    auVar9[10] = uStack_b93;
    auVar9[0xb] = 0;
    auVar9[0xc] = uStack_b92;
    auVar9[0xd] = 0;
    auVar9[0xe] = uStack_b91;
    auVar9[0xf] = 0;
    auVar15 = pshufb(auVar9,auVar8);
    local_2f8 = auVar15._0_2_;
    sStack_2f6 = auVar15._2_2_;
    sStack_2f4 = auVar15._4_2_;
    sStack_2f2 = auVar15._6_2_;
    sStack_2f0 = auVar15._8_2_;
    sStack_2ee = auVar15._10_2_;
    sStack_2ec = auVar15._12_2_;
    sStack_2ea = auVar15._14_2_;
    uVar11 = uVar10 + local_2f8 * 0xff + 0x80;
    uVar16 = sVar45 + sStack_2f6 * 0xe1 + 0x80;
    uVar20 = sVar47 + sStack_2f4 * 0xc4 + 0x80;
    uVar24 = sVar49 + sStack_2f2 * 0xaa + 0x80;
    uVar28 = sVar51 + sStack_2f0 * 0x91 + 0x80;
    uVar32 = sVar53 + sStack_2ee * 0x7b + 0x80;
    uVar36 = sVar55 + sStack_2ec * 0x66 + 0x80;
    uVar40 = sVar57 + sStack_2ea * 0x54 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar44 + local_2f8 * 0x44 + 0x80;
    uVar18 = sVar46 + sStack_2f6 * 0x36 + 0x80;
    uVar22 = sVar48 + sStack_2f4 * 0x2b + 0x80;
    uVar26 = sVar50 + sStack_2f2 * 0x21 + 0x80;
    uVar30 = sVar52 + sStack_2f0 * 0x1a + 0x80;
    uVar34 = sVar54 + sStack_2ee * 0x14 + 0x80;
    uVar38 = sVar56 + sStack_2ec * 0x11 + 0x80;
    uVar42 = sVar58 + sStack_2ea * 0x10 + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    *local_d18 = CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                          CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                                   (0xff < uVar37),
                                   CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                            (0xff < uVar33),
                                            CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                     (char)(uVar28 >> 8) - (0xff < uVar29),
                                                     CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                              (char)(uVar24 >> 8) - (0xff < uVar25),
                                                              CONCAT12((uVar21 != 0) *
                                                                       (uVar21 < 0x100) *
                                                                       (char)(uVar20 >> 8) -
                                                                       (0xff < uVar21),
                                                                       CONCAT11((uVar17 != 0) *
                                                                                (uVar17 < 0x100) *
                                                                                (char)(uVar16 >> 8)
                                                                                - (0xff < uVar17),
                                                                                (uVar12 != 0) *
                                                                                (uVar12 < 0x100) *
                                                                                (char)(uVar11 >> 8)
                                                                                - (0xff < uVar12))))
                                                    ))));
    local_d18[1] = CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43)
                            ,CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) -
                                      (0xff < uVar39),
                                      CONCAT15((uVar35 != 0) * (uVar35 < 0x100) *
                                               (char)(uVar34 >> 8) - (0xff < uVar35),
                                               CONCAT14((uVar31 != 0) * (uVar31 < 0x100) *
                                                        (char)(uVar30 >> 8) - (0xff < uVar31),
                                                        CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                                 (char)(uVar26 >> 8) -
                                                                 (0xff < uVar27),
                                                                 CONCAT12((uVar23 != 0) *
                                                                          (uVar23 < 0x100) *
                                                                          (char)(uVar22 >> 8) -
                                                                          (0xff < uVar23),
                                                                          CONCAT11((uVar19 != 0) *
                                                                                   (uVar19 < 0x100)
                                                                                   * (char)(uVar18 
                                                  >> 8) - (0xff < uVar19),
                                                  (uVar14 != 0) * (uVar14 < 0x100) *
                                                  (char)(uVar13 >> 8) - (0xff < uVar14))))))));
    local_d18 = (undefined8 *)(in_RSI + (long)local_d18);
  }
  uVar1 = in_RCX[1];
  local_bd8 = (byte)uVar1;
  uStack_bd7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_bd6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_bd5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_bd4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_bd3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_bd2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_bd1 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_e1c = 0x1000100; local_e1c < 0xf0e0f0f; local_e1c = local_e1c + 0x2020202) {
    auVar6._4_4_ = local_e1c;
    auVar6._0_4_ = local_e1c;
    auVar6._12_4_ = local_e1c;
    auVar6._8_4_ = local_e1c;
    auVar7[1] = 0;
    auVar7[0] = local_bd8;
    auVar7[2] = uStack_bd7;
    auVar7[3] = 0;
    auVar7[4] = uStack_bd6;
    auVar7[5] = 0;
    auVar7[6] = uStack_bd5;
    auVar7[7] = 0;
    auVar7[9] = 0;
    auVar7[8] = bStack_bd4;
    auVar7[10] = uStack_bd3;
    auVar7[0xb] = 0;
    auVar7[0xc] = uStack_bd2;
    auVar7[0xd] = 0;
    auVar7[0xe] = uStack_bd1;
    auVar7[0xf] = 0;
    auVar15 = pshufb(auVar7,auVar6);
    local_4b8 = auVar15._0_2_;
    sStack_4b6 = auVar15._2_2_;
    sStack_4b4 = auVar15._4_2_;
    sStack_4b2 = auVar15._6_2_;
    sStack_4b0 = auVar15._8_2_;
    sStack_4ae = auVar15._10_2_;
    sStack_4ac = auVar15._12_2_;
    sStack_4aa = auVar15._14_2_;
    uVar11 = uVar10 + local_4b8 * 0xff + 0x80;
    uVar16 = sVar45 + sStack_4b6 * 0xe1 + 0x80;
    uVar20 = sVar47 + sStack_4b4 * 0xc4 + 0x80;
    uVar24 = sVar49 + sStack_4b2 * 0xaa + 0x80;
    uVar28 = sVar51 + sStack_4b0 * 0x91 + 0x80;
    uVar32 = sVar53 + sStack_4ae * 0x7b + 0x80;
    uVar36 = sVar55 + sStack_4ac * 0x66 + 0x80;
    uVar40 = sVar57 + sStack_4aa * 0x54 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar44 + local_4b8 * 0x44 + 0x80;
    uVar18 = sVar46 + sStack_4b6 * 0x36 + 0x80;
    uVar22 = sVar48 + sStack_4b4 * 0x2b + 0x80;
    uVar26 = sVar50 + sStack_4b2 * 0x21 + 0x80;
    uVar30 = sVar52 + sStack_4b0 * 0x1a + 0x80;
    uVar34 = sVar54 + sStack_4ae * 0x14 + 0x80;
    uVar38 = sVar56 + sStack_4ac * 0x11 + 0x80;
    uVar42 = sVar58 + sStack_4aa * 0x10 + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    *local_d18 = CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                          CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                                   (0xff < uVar37),
                                   CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                            (0xff < uVar33),
                                            CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                     (char)(uVar28 >> 8) - (0xff < uVar29),
                                                     CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                              (char)(uVar24 >> 8) - (0xff < uVar25),
                                                              CONCAT12((uVar21 != 0) *
                                                                       (uVar21 < 0x100) *
                                                                       (char)(uVar20 >> 8) -
                                                                       (0xff < uVar21),
                                                                       CONCAT11((uVar17 != 0) *
                                                                                (uVar17 < 0x100) *
                                                                                (char)(uVar16 >> 8)
                                                                                - (0xff < uVar17),
                                                                                (uVar12 != 0) *
                                                                                (uVar12 < 0x100) *
                                                                                (char)(uVar11 >> 8)
                                                                                - (0xff < uVar12))))
                                                    ))));
    local_d18[1] = CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43)
                            ,CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) -
                                      (0xff < uVar39),
                                      CONCAT15((uVar35 != 0) * (uVar35 < 0x100) *
                                               (char)(uVar34 >> 8) - (0xff < uVar35),
                                               CONCAT14((uVar31 != 0) * (uVar31 < 0x100) *
                                                        (char)(uVar30 >> 8) - (0xff < uVar31),
                                                        CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                                 (char)(uVar26 >> 8) -
                                                                 (0xff < uVar27),
                                                                 CONCAT12((uVar23 != 0) *
                                                                          (uVar23 < 0x100) *
                                                                          (char)(uVar22 >> 8) -
                                                                          (0xff < uVar23),
                                                                          CONCAT11((uVar19 != 0) *
                                                                                   (uVar19 < 0x100)
                                                                                   * (char)(uVar18 
                                                  >> 8) - (0xff < uVar19),
                                                  (uVar14 != 0) * (uVar14 < 0x100) *
                                                  (char)(uVar13 >> 8) - (0xff < uVar14))))))));
    local_d18 = (undefined8 *)(in_RSI + (long)local_d18);
  }
  uVar1 = in_RCX[2];
  local_c18 = (byte)uVar1;
  uStack_c17 = (undefined1)((ulong)uVar1 >> 8);
  uStack_c16 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_c15 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_c14 = (byte)((ulong)uVar1 >> 0x20);
  uStack_c13 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_c12 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_c11 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_e4c = 0x1000100; local_e4c < 0xf0e0f0f; local_e4c = local_e4c + 0x2020202) {
    auVar4._4_4_ = local_e4c;
    auVar4._0_4_ = local_e4c;
    auVar4._12_4_ = local_e4c;
    auVar4._8_4_ = local_e4c;
    auVar5[1] = 0;
    auVar5[0] = local_c18;
    auVar5[2] = uStack_c17;
    auVar5[3] = 0;
    auVar5[4] = uStack_c16;
    auVar5[5] = 0;
    auVar5[6] = uStack_c15;
    auVar5[7] = 0;
    auVar5[9] = 0;
    auVar5[8] = bStack_c14;
    auVar5[10] = uStack_c13;
    auVar5[0xb] = 0;
    auVar5[0xc] = uStack_c12;
    auVar5[0xd] = 0;
    auVar5[0xe] = uStack_c11;
    auVar5[0xf] = 0;
    auVar15 = pshufb(auVar5,auVar4);
    local_678 = auVar15._0_2_;
    sStack_676 = auVar15._2_2_;
    sStack_674 = auVar15._4_2_;
    sStack_672 = auVar15._6_2_;
    sStack_670 = auVar15._8_2_;
    sStack_66e = auVar15._10_2_;
    sStack_66c = auVar15._12_2_;
    sStack_66a = auVar15._14_2_;
    uVar11 = uVar10 + local_678 * 0xff + 0x80;
    uVar16 = sVar45 + sStack_676 * 0xe1 + 0x80;
    uVar20 = sVar47 + sStack_674 * 0xc4 + 0x80;
    uVar24 = sVar49 + sStack_672 * 0xaa + 0x80;
    uVar28 = sVar51 + sStack_670 * 0x91 + 0x80;
    uVar32 = sVar53 + sStack_66e * 0x7b + 0x80;
    uVar36 = sVar55 + sStack_66c * 0x66 + 0x80;
    uVar40 = sVar57 + sStack_66a * 0x54 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar44 + local_678 * 0x44 + 0x80;
    uVar18 = sVar46 + sStack_676 * 0x36 + 0x80;
    uVar22 = sVar48 + sStack_674 * 0x2b + 0x80;
    uVar26 = sVar50 + sStack_672 * 0x21 + 0x80;
    uVar30 = sVar52 + sStack_670 * 0x1a + 0x80;
    uVar34 = sVar54 + sStack_66e * 0x14 + 0x80;
    uVar38 = sVar56 + sStack_66c * 0x11 + 0x80;
    uVar42 = sVar58 + sStack_66a * 0x10 + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    *local_d18 = CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                          CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                                   (0xff < uVar37),
                                   CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                            (0xff < uVar33),
                                            CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                     (char)(uVar28 >> 8) - (0xff < uVar29),
                                                     CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                              (char)(uVar24 >> 8) - (0xff < uVar25),
                                                              CONCAT12((uVar21 != 0) *
                                                                       (uVar21 < 0x100) *
                                                                       (char)(uVar20 >> 8) -
                                                                       (0xff < uVar21),
                                                                       CONCAT11((uVar17 != 0) *
                                                                                (uVar17 < 0x100) *
                                                                                (char)(uVar16 >> 8)
                                                                                - (0xff < uVar17),
                                                                                (uVar12 != 0) *
                                                                                (uVar12 < 0x100) *
                                                                                (char)(uVar11 >> 8)
                                                                                - (0xff < uVar12))))
                                                    ))));
    local_d18[1] = CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43)
                            ,CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) -
                                      (0xff < uVar39),
                                      CONCAT15((uVar35 != 0) * (uVar35 < 0x100) *
                                               (char)(uVar34 >> 8) - (0xff < uVar35),
                                               CONCAT14((uVar31 != 0) * (uVar31 < 0x100) *
                                                        (char)(uVar30 >> 8) - (0xff < uVar31),
                                                        CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                                 (char)(uVar26 >> 8) -
                                                                 (0xff < uVar27),
                                                                 CONCAT12((uVar23 != 0) *
                                                                          (uVar23 < 0x100) *
                                                                          (char)(uVar22 >> 8) -
                                                                          (0xff < uVar23),
                                                                          CONCAT11((uVar19 != 0) *
                                                                                   (uVar19 < 0x100)
                                                                                   * (char)(uVar18 
                                                  >> 8) - (0xff < uVar19),
                                                  (uVar14 != 0) * (uVar14 < 0x100) *
                                                  (char)(uVar13 >> 8) - (0xff < uVar14))))))));
    local_d18 = (undefined8 *)(in_RSI + (long)local_d18);
  }
  uVar1 = in_RCX[3];
  local_c58 = (byte)uVar1;
  uStack_c57 = (undefined1)((ulong)uVar1 >> 8);
  uStack_c56 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_c55 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_c54 = (byte)((ulong)uVar1 >> 0x20);
  uStack_c53 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_c52 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_c51 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_e7c = 0x1000100; local_e7c < 0xf0e0f0f; local_e7c = local_e7c + 0x2020202) {
    auVar15._4_4_ = local_e7c;
    auVar15._0_4_ = local_e7c;
    auVar15._12_4_ = local_e7c;
    auVar15._8_4_ = local_e7c;
    auVar3[1] = 0;
    auVar3[0] = local_c58;
    auVar3[2] = uStack_c57;
    auVar3[3] = 0;
    auVar3[4] = uStack_c56;
    auVar3[5] = 0;
    auVar3[6] = uStack_c55;
    auVar3[7] = 0;
    auVar3[9] = 0;
    auVar3[8] = bStack_c54;
    auVar3[10] = uStack_c53;
    auVar3[0xb] = 0;
    auVar3[0xc] = uStack_c52;
    auVar3[0xd] = 0;
    auVar3[0xe] = uStack_c51;
    auVar3[0xf] = 0;
    auVar15 = pshufb(auVar3,auVar15);
    local_838 = auVar15._0_2_;
    sStack_836 = auVar15._2_2_;
    sStack_834 = auVar15._4_2_;
    sStack_832 = auVar15._6_2_;
    sStack_830 = auVar15._8_2_;
    sStack_82e = auVar15._10_2_;
    sStack_82c = auVar15._12_2_;
    sStack_82a = auVar15._14_2_;
    uVar11 = uVar10 + local_838 * 0xff + 0x80;
    uVar16 = sVar45 + sStack_836 * 0xe1 + 0x80;
    uVar20 = sVar47 + sStack_834 * 0xc4 + 0x80;
    uVar24 = sVar49 + sStack_832 * 0xaa + 0x80;
    uVar28 = sVar51 + sStack_830 * 0x91 + 0x80;
    uVar32 = sVar53 + sStack_82e * 0x7b + 0x80;
    uVar36 = sVar55 + sStack_82c * 0x66 + 0x80;
    uVar40 = sVar57 + sStack_82a * 0x54 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar44 + local_838 * 0x44 + 0x80;
    uVar18 = sVar46 + sStack_836 * 0x36 + 0x80;
    uVar22 = sVar48 + sStack_834 * 0x2b + 0x80;
    uVar26 = sVar50 + sStack_832 * 0x21 + 0x80;
    uVar30 = sVar52 + sStack_830 * 0x1a + 0x80;
    uVar34 = sVar54 + sStack_82e * 0x14 + 0x80;
    uVar38 = sVar56 + sStack_82c * 0x11 + 0x80;
    uVar42 = sVar58 + sStack_82a * 0x10 + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    *local_d18 = CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                          CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                                   (0xff < uVar37),
                                   CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                            (0xff < uVar33),
                                            CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                     (char)(uVar28 >> 8) - (0xff < uVar29),
                                                     CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                              (char)(uVar24 >> 8) - (0xff < uVar25),
                                                              CONCAT12((uVar21 != 0) *
                                                                       (uVar21 < 0x100) *
                                                                       (char)(uVar20 >> 8) -
                                                                       (0xff < uVar21),
                                                                       CONCAT11((uVar17 != 0) *
                                                                                (uVar17 < 0x100) *
                                                                                (char)(uVar16 >> 8)
                                                                                - (0xff < uVar17),
                                                                                (uVar12 != 0) *
                                                                                (uVar12 < 0x100) *
                                                                                (char)(uVar11 >> 8)
                                                                                - (0xff < uVar12))))
                                                    ))));
    local_d18[1] = CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43)
                            ,CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) -
                                      (0xff < uVar39),
                                      CONCAT15((uVar35 != 0) * (uVar35 < 0x100) *
                                               (char)(uVar34 >> 8) - (0xff < uVar35),
                                               CONCAT14((uVar31 != 0) * (uVar31 < 0x100) *
                                                        (char)(uVar30 >> 8) - (0xff < uVar31),
                                                        CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                                 (char)(uVar26 >> 8) -
                                                                 (0xff < uVar27),
                                                                 CONCAT12((uVar23 != 0) *
                                                                          (uVar23 < 0x100) *
                                                                          (char)(uVar22 >> 8) -
                                                                          (0xff < uVar23),
                                                                          CONCAT11((uVar19 != 0) *
                                                                                   (uVar19 < 0x100)
                                                                                   * (char)(uVar18 
                                                  >> 8) - (0xff < uVar19),
                                                  (uVar14 != 0) * (uVar14 < 0x100) *
                                                  (char)(uVar13 >> 8) - (0xff < uVar14))))))));
    local_d18 = (undefined8 *)(in_RSI + (long)local_d18);
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_16x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[15]);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 16));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 24));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
}